

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore_t *rawSeqStore,size_t nbBytes)

{
  U32 UVar1;
  undefined4 uVar2;
  bool bVar3;
  rawSeq currSeq;
  U32 currPos;
  size_t nbBytes_local;
  rawSeqStore_t *rawSeqStore_local;
  
  currPos = (int)rawSeqStore->posInSequence + (int)nbBytes;
  while( true ) {
    bVar3 = false;
    if (currPos != 0) {
      bVar3 = rawSeqStore->pos < rawSeqStore->size;
    }
    if (!bVar3) goto LAB_002e7ebb;
    uVar2 = rawSeqStore->seq[rawSeqStore->pos].litLength;
    UVar1 = rawSeqStore->seq[rawSeqStore->pos].matchLength;
    if (currPos < uVar2 + UVar1) break;
    currPos = currPos - (uVar2 + UVar1);
    rawSeqStore->pos = rawSeqStore->pos + 1;
  }
  rawSeqStore->posInSequence = (ulong)currPos;
LAB_002e7ebb:
  if ((currPos == 0) || (rawSeqStore->pos == rawSeqStore->size)) {
    rawSeqStore->posInSequence = 0;
  }
  return;
}

Assistant:

void ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes) {
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}